

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ForkedPromiseAwaiter<void>::~ForkedPromiseAwaiter(ForkedPromiseAwaiter<void> *this)

{
  if ((this->awaiter).result.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception
              (&(this->awaiter).result.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  PromiseAwaiterBase::~PromiseAwaiterBase(&(this->awaiter).super_PromiseAwaiterBase);
  ForkBranchBase::~ForkBranchBase((ForkBranchBase *)this);
  return;
}

Assistant:

ForkedPromiseAwaiter(ForkedPromise<T>& promise)
      : node(promise), awaiter(OwnPromiseNode(&node)) { }